

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  SSL_METHOD *meth;
  SSL_CTX *pSVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  void *__dest;
  undefined1 *__dest_00;
  SSL *pSVar8;
  undefined8 uVar9;
  ulong uVar10;
  ushort uVar11;
  char *unaff_R15;
  sigaction act;
  http_parser_url local_100;
  undefined8 local_e0;
  SSL_CTX *local_d8;
  char *local_d0;
  _union_1457 local_c8 [19];
  
  if (argc < 2) {
    main_cold_1();
  }
  else {
    memset(local_c8,0,0x98);
    local_c8[0] = (_union_1457)0x1;
    sigaction(0xd,(sigaction *)local_c8,(sigaction *)0x0);
    unaff_R15 = argv[1];
    sVar2 = strlen(unaff_R15);
    iVar1 = http_parser_parse_url(unaff_R15,sVar2,0,&local_100);
    if (iVar1 == 0) {
      pcVar3 = strndup(unaff_R15 + local_100.field_data[1].off,(ulong)local_100.field_data[1].len);
      uVar11 = 0x1bb;
      if ((local_100.field_set & 4) != 0) {
        uVar11 = local_100.port;
      }
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar4 = SSL_CTX_new(meth);
      if (pSVar4 == (SSL_CTX *)0x0) {
        uVar10 = ERR_get_error();
        unaff_R15 = ERR_error_string(uVar10,(char *)0x0);
        pcVar3 = "Could not create SSL/TLS context: %s";
      }
      else {
        local_d0 = pcVar3;
        SSL_CTX_set_options(pSVar4,0x82030850);
        local_d8 = pSVar4;
        SSL_CTX_set_alpn_protos(pSVar4,"\x02h2",3);
        uVar5 = event_base_new();
        puVar6 = (undefined8 *)malloc(0x20);
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6[2] = 0;
        puVar6[3] = 0;
        local_e0 = uVar5;
        uVar5 = evdns_base_new(uVar5,1);
        puVar6[1] = uVar5;
        puVar7 = (undefined8 *)malloc(0x38);
        *puVar7 = unaff_R15;
        puVar7[1] = &local_100;
        *(undefined4 *)(puVar7 + 6) = 0xffffffff;
        uVar10 = (ulong)local_100.field_data[1].len;
        puVar7[4] = uVar10;
        __dest = malloc(uVar10 + 7);
        puVar7[2] = __dest;
        memcpy(__dest,unaff_R15 + local_100.field_data[1].off,uVar10);
        if ((local_100.field_set & 4) != 0) {
          iVar1 = snprintf((char *)((long)__dest + uVar10),7,":%u",(ulong)local_100.port);
          puVar7[4] = (long)iVar1 + uVar10;
        }
        puVar7[5] = 1;
        if ((local_100.field_set & 8) != 0) {
          puVar7[5] = (ulong)local_100.field_data[3].len;
        }
        if ((local_100.field_set & 0x10) != 0) {
          puVar7[5] = (ulong)local_100.field_data[4].len + puVar7[5] + 1;
        }
        sVar2 = puVar7[5];
        __dest_00 = (undefined1 *)malloc(sVar2);
        puVar7[3] = __dest_00;
        if ((local_100.field_set & 8) == 0) {
          *__dest_00 = 0x2f;
        }
        else {
          memcpy(__dest_00,unaff_R15 + local_100.field_data[3].off,
                 (ulong)local_100.field_data[3].len);
        }
        if ((local_100.field_set & 0x10) != 0) {
          uVar10 = (ulong)local_100.field_data[4].len;
          __dest_00[~uVar10 + sVar2] = 0x3f;
          memcpy(__dest_00 + (sVar2 - uVar10),unaff_R15 + local_100.field_data[4].off,uVar10);
        }
        pSVar4 = local_d8;
        puVar6[3] = puVar7;
        pSVar8 = SSL_new(local_d8);
        unaff_R15 = local_d0;
        uVar5 = local_e0;
        if (pSVar8 == (SSL *)0x0) {
          uVar10 = ERR_get_error();
          unaff_R15 = ERR_error_string(uVar10,(char *)0x0);
          pcVar3 = "Could not create SSL/TLS session object: %s";
        }
        else {
          uVar9 = bufferevent_openssl_socket_new(local_e0,0xffffffff,pSVar8,1,5);
          bufferevent_enable(uVar9,6);
          bufferevent_setcb(uVar9,readcb,writecb,eventcb,puVar6);
          iVar1 = bufferevent_socket_connect_hostname(uVar9,puVar6[1],0,unaff_R15,uVar11);
          if (iVar1 == 0) {
            puVar6[2] = uVar9;
            free(unaff_R15);
            event_base_loop(uVar5,0);
            event_base_free(uVar5);
            SSL_CTX_free(pSVar4);
            return 0;
          }
          pcVar3 = "Could not connect to the remote host %s";
        }
      }
      goto LAB_00102a62;
    }
  }
  pcVar3 = "Could not parse URI %s";
LAB_00102a62:
  errx(1,pcVar3,unaff_R15);
}

Assistant:

int main(int argc, char **argv) {
  struct sigaction act;

  if (argc < 2) {
    fprintf(stderr, "Usage: libevent-client HTTPS_URI\n");
    exit(EXIT_FAILURE);
  }

  memset(&act, 0, sizeof(struct sigaction));
  act.sa_handler = SIG_IGN;
  sigaction(SIGPIPE, &act, NULL);

  run(argv[1]);
  return 0;
}